

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O2

void NOPN2_WriteBuffered(ym3438_t *chip,UINT8 port,UINT8 data)

{
  byte bVar1;
  Bit64u BVar2;
  Bit64u BVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  Bit32s buffer [2];
  Bit32s aBStack_38 [2];
  
  uVar4 = (ulong)chip->writebuf_last;
  bVar1 = chip->writebuf[uVar4].port;
  if ((bVar1 & 4) != 0) {
    NOPN2_Write(chip,bVar1 & 3,chip->writebuf[uVar4].data);
    chip->writebuf_cur = chip->writebuf_last + 1 & 0x7ff;
    BVar2 = chip->writebuf[chip->writebuf_last].time;
    BVar3 = chip->writebuf_samplecnt;
    chip->writebuf_samplecnt = BVar2;
    for (lVar6 = BVar3 - BVar2; lVar6 != 0; lVar6 = lVar6 + 1) {
      NOPN2_Clock(chip,aBStack_38);
    }
    uVar4 = (ulong)chip->writebuf_last;
  }
  chip->writebuf[uVar4].port = port & 3 | 4;
  chip->writebuf[uVar4].data = data;
  uVar5 = chip->writebuf_lasttime + 0xf;
  if (uVar5 <= chip->writebuf_samplecnt) {
    uVar5 = chip->writebuf_samplecnt;
  }
  chip->writebuf[uVar4].time = uVar5;
  chip->writebuf_lasttime = uVar5;
  chip->writebuf_last = (int)uVar4 + 1U & 0x7ff;
  return;
}

Assistant:

void NOPN2_WriteBuffered(ym3438_t *chip, UINT8 port, UINT8 data)
{
    Bit64u time1, time2;
    Bit32s buffer[2];
    Bit64u skip;

    if (chip->writebuf[chip->writebuf_last].port & 0x04)
    {
        NOPN2_Write(chip, chip->writebuf[chip->writebuf_last].port & 0X03,
                   chip->writebuf[chip->writebuf_last].data);

        chip->writebuf_cur = (chip->writebuf_last + 1) % NOPN_WRITEBUF_SIZE;
        skip = chip->writebuf[chip->writebuf_last].time - chip->writebuf_samplecnt;
        chip->writebuf_samplecnt = chip->writebuf[chip->writebuf_last].time;
        while (skip--)
        {
            NOPN2_Clock(chip, buffer);
        }
    }

    chip->writebuf[chip->writebuf_last].port = (port & 0x03) | 0x04;
    chip->writebuf[chip->writebuf_last].data = data;
    time1 = chip->writebuf_lasttime + NOPN_WRITEBUF_DELAY;
    time2 = chip->writebuf_samplecnt;

    if (time1 < time2)
    {
        time1 = time2;
    }

    chip->writebuf[chip->writebuf_last].time = time1;
    chip->writebuf_lasttime = time1;
    chip->writebuf_last = (chip->writebuf_last + 1) % NOPN_WRITEBUF_SIZE;
}